

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_serpent.cpp
# Opt level: O0

int AF_A_SerpentMeleeAttack
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  int iVar1;
  AActor *pAVar2;
  AActor *target;
  bool bVar3;
  VMValue *local_100;
  int local_e4;
  bool local_c2;
  bool local_bf;
  undefined1 local_a8 [8];
  VMValue params [3];
  TAngle<double> local_68;
  FName local_5c;
  int local_58;
  int local_54;
  int newdam;
  int damage;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                  ,0xbf,
                  "int AF_A_SerpentMeleeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_bf = true;
    if (stateowner != (AActor *)0x0) {
      local_bf = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_bf == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                    ,0xbf,
                    "int AF_A_SerpentMeleeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
        bVar3 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                      ,0xbf,
                      "int AF_A_SerpentMeleeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
      local_c2 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_c2 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_c2 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                      ,0xbf,
                      "int AF_A_SerpentMeleeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
        bVar3 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                      ,0xbf,
                      "int AF_A_SerpentMeleeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      _newdam = pVStack_20[(int)self].field_0.field_1.a;
    }
    else {
      _newdam = (void *)0x0;
    }
    pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->target);
    if (pAVar2 != (AActor *)0x0) {
      bVar3 = AActor::CheckMeleeRange(stateowner);
      if (bVar3) {
        local_54 = FRandom::HitDice(&pr_serpentmeattack,5);
        target = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->target);
        pAVar2 = stateowner;
        iVar1 = local_54;
        FName::FName(&local_5c,NAME_Melee);
        TAngle<double>::TAngle(&local_68,0.0);
        local_58 = P_DamageMobj(target,pAVar2,pAVar2,iVar1,&local_5c,0,&local_68);
        local_e4 = local_58;
        if (local_58 < 1) {
          local_e4 = local_54;
        }
        pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->target);
        P_TraceBleed(local_e4,pAVar2,stateowner);
        pAVar2 = stateowner;
        FSoundID::FSoundID((FSoundID *)&stack0xffffffffffffff94,"SerpentMeleeHit");
        S_Sound(pAVar2,4,(FSoundID *)&stack0xffffffffffffff94,1.0,1.0);
      }
      iVar1 = FRandom::operator()(&pr_serpentmeattack);
      if (iVar1 < 0x60) {
        VMValue::VMValue((VMValue *)local_a8,(DObject *)stateowner);
        VMValue::VMValue((VMValue *)((long)&params[0].field_0 + 8),(DObject *)stateowner);
        VMValue::VMValue((VMValue *)((long)&params[1].field_0 + 8),(void *)0x0,8);
        VMFrameStack::Call((VMFrameStack *)param_local,
                           &A_SerpentCheckForAttack_VMPtr->super_VMFunction,(VMValue *)local_a8,3,
                           (VMReturn *)0x0,0,(VMException **)0x0);
        local_100 = (VMValue *)((long)&params[2].field_0 + 8);
        do {
          local_100 = local_100 + -1;
          VMValue::~VMValue(local_100);
        } while (local_100 != (VMValue *)local_a8);
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                ,0xbf,"int AF_A_SerpentMeleeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SerpentMeleeAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
	{
		return 0;
	}
	if (self->CheckMeleeRange ())
	{
		int damage = pr_serpentmeattack.HitDice (5);
		int newdam = P_DamageMobj (self->target, self, self, damage, NAME_Melee);
		P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
		S_Sound (self, CHAN_BODY, "SerpentMeleeHit", 1, ATTN_NORM);
	}
	if (pr_serpentmeattack() < 96)
	{
		CALL_ACTION(A_SerpentCheckForAttack, self);
	}
	return 0;
}